

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O1

LightSamplerHandle
pbrt::LightSamplerHandle::Create(string *name,span<const_pbrt::LightHandle> lights,Allocator alloc)

{
  int iVar1;
  ExhaustiveLightSampler *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  LightHandle *first;
  ulong uVar2;
  LightHandle *pLVar3;
  Allocator in_R8;
  span<const_pbrt::LightHandle> lights_00;
  span<const_pbrt::LightHandle> lights_01;
  span<const_pbrt::LightHandle> lights_02;
  string ret;
  string local_58;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_38;
  undefined4 extraout_var;
  
  first = (LightHandle *)lights.n;
  pLVar3 = lights.ptr;
  iVar1 = std::__cxx11::string::compare((char *)pLVar3);
  if (iVar1 == 0) {
    iVar1 = (*(in_R8.memoryResource)->_vptr_memory_resource[2])();
    this = (ExhaustiveLightSampler *)CONCAT44(extraout_var_00,iVar1);
    pstd::vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>>::
    vector<pbrt::LightHandle_const*>
              ((vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>> *)this
               ,first,first + (long)alloc.memoryResource,
               (polymorphic_allocator<pbrt::LightHandle> *)&local_58);
    uVar2 = 0x1000000000000;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)pLVar3);
    if (iVar1 == 0) {
      iVar1 = (*(in_R8.memoryResource)->_vptr_memory_resource[2])();
      this = (ExhaustiveLightSampler *)CONCAT44(extraout_var_01,iVar1);
      lights_01.n = (size_t)alloc.memoryResource;
      lights_01.ptr = first;
      PowerLightSampler::PowerLightSampler((PowerLightSampler *)this,lights_01,in_R8);
      uVar2 = 0x2000000000000;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)pLVar3);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)pLVar3);
        if (iVar1 == 0) {
          iVar1 = (*(in_R8.memoryResource)->_vptr_memory_resource[2])();
          this = (ExhaustiveLightSampler *)CONCAT44(extraout_var_02,iVar1);
          lights_02.n = (size_t)alloc.memoryResource;
          lights_02.ptr = first;
          ExhaustiveLightSampler::ExhaustiveLightSampler(this,lights_02,in_R8);
          uVar2 = 0x4000000000000;
          goto LAB_00373aa6;
        }
        local_38.bits =
             (pLVar3->
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             ).bits;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        detail::stringPrintfRecursive<char_const*>
                  (&local_58,"Light sample distribution type \"%s\" unknown. Using \"bvh\".",
                   (char **)&local_38);
        Error((FileLoc *)0x0,local_58._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      uVar2 = 0x3000000000000;
      iVar1 = (*(in_R8.memoryResource)->_vptr_memory_resource[2])();
      this = (ExhaustiveLightSampler *)CONCAT44(extraout_var,iVar1);
      lights_00.n = (size_t)alloc.memoryResource;
      lights_00.ptr = first;
      BVHLightSampler::BVHLightSampler((BVHLightSampler *)this,lights_00,in_R8);
    }
  }
LAB_00373aa6:
  (name->_M_dataplus)._M_p = (pointer)((ulong)this | uVar2);
  return (LightSamplerHandle)
         (TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          )name;
}

Assistant:

LightSamplerHandle LightSamplerHandle::Create(const std::string &name,
                                              pstd::span<const LightHandle> lights,
                                              Allocator alloc) {
    if (name == "uniform")
        return alloc.new_object<UniformLightSampler>(lights, alloc);
    else if (name == "power")
        return alloc.new_object<PowerLightSampler>(lights, alloc);
    else if (name == "bvh")
        return alloc.new_object<BVHLightSampler>(lights, alloc);
    else if (name == "exhaustive")
        return alloc.new_object<ExhaustiveLightSampler>(lights, alloc);
    else {
        Error(R"(Light sample distribution type "%s" unknown. Using "bvh".)",
              name.c_str());
        return alloc.new_object<BVHLightSampler>(lights, alloc);
    }
}